

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

void GPU_GetVirtualResolution(GPU_Target *target,Uint16 *w,Uint16 *h)

{
  Uint16 UVar1;
  
  if (target == (GPU_Target *)0x0) {
    *w = 0;
    UVar1 = 0;
  }
  else {
    *w = target->w;
    UVar1 = target->h;
  }
  *h = UVar1;
  return;
}

Assistant:

void GPU_GetVirtualResolution(GPU_Target* target, Uint16* w, Uint16* h)
{
    // No checking here for NULL w or h...  Should we?
	if (target == NULL)
	{
		*w = 0;
		*h = 0;
	}
	else {
		*w = target->w;
		*h = target->h;
	}
}